

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcVerify.c
# Opt level: O0

void Abc_NtkSecSat(Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtk2,int nConfLimit,int nInsLimit,int nFrames)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  Abc_Ntk_t *pMiter_00;
  int RetValue;
  Abc_Ntk_t *pCnf;
  Abc_Ntk_t *pFrames;
  Abc_Ntk_t *pMiter;
  int nFrames_local;
  int nInsLimit_local;
  int nConfLimit_local;
  Abc_Ntk_t *pNtk2_local;
  Abc_Ntk_t *pNtk1_local;
  
  pAVar2 = Abc_NtkMiter(pNtk1,pNtk2,0,0,0,0);
  if (pAVar2 == (Abc_Ntk_t *)0x0) {
    printf("Miter computation has failed.\n");
  }
  else {
    iVar1 = Abc_NtkMiterIsConstant(pAVar2);
    if (iVar1 == 0) {
      Abc_NtkDelete(pAVar2);
      printf("Networks are NOT EQUIVALENT after structural hashing.\n");
    }
    else if (iVar1 == 1) {
      Abc_NtkDelete(pAVar2);
      printf("Networks are equivalent after structural hashing.\n");
    }
    else {
      pMiter_00 = Abc_NtkFrames(pAVar2,nFrames,1,0);
      Abc_NtkDelete(pAVar2);
      if (pMiter_00 == (Abc_Ntk_t *)0x0) {
        printf("Frames computation has failed.\n");
      }
      else {
        iVar1 = Abc_NtkMiterIsConstant(pMiter_00);
        if (iVar1 == 0) {
          Abc_NtkDelete(pMiter_00);
          printf("Networks are NOT EQUIVALENT after framing.\n");
        }
        else if (iVar1 == 1) {
          Abc_NtkDelete(pMiter_00);
          printf("Networks are equivalent after framing.\n");
        }
        else {
          pAVar2 = Abc_NtkMulti(pMiter_00,0,100,1,0,0,0);
          Abc_NtkDelete(pMiter_00);
          if (pAVar2 == (Abc_Ntk_t *)0x0) {
            printf("Renoding for CNF has failed.\n");
          }
          else {
            iVar1 = Abc_NtkMiterSat(pAVar2,(long)nConfLimit,(long)nInsLimit,0,(ABC_INT64_T *)0x0,
                                    (ABC_INT64_T *)0x0);
            if (iVar1 == -1) {
              printf("Networks are undecided (SAT solver timed out).\n");
            }
            else if (iVar1 == 0) {
              printf("Networks are NOT EQUIVALENT after SAT.\n");
            }
            else {
              printf("Networks are equivalent after SAT.\n");
            }
            Abc_NtkDelete(pAVar2);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Abc_NtkSecSat( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, int nConfLimit, int nInsLimit, int nFrames )
{
    extern Abc_Ntk_t * Abc_NtkMulti( Abc_Ntk_t * pNtk, int nThresh, int nFaninMax, int fCnf, int fMulti, int fSimple, int fFactor );
    Abc_Ntk_t * pMiter;
    Abc_Ntk_t * pFrames;
    Abc_Ntk_t * pCnf;
    int RetValue;

    // get the miter of the two networks
    pMiter = Abc_NtkMiter( pNtk1, pNtk2, 0, 0, 0, 0 );
    if ( pMiter == NULL )
    {
        printf( "Miter computation has failed.\n" );
        return;
    }
    RetValue = Abc_NtkMiterIsConstant( pMiter );
    if ( RetValue == 0 )
    {
        Abc_NtkDelete( pMiter );
        printf( "Networks are NOT EQUIVALENT after structural hashing.\n" );
        return;
    }
    if ( RetValue == 1 )
    {
        Abc_NtkDelete( pMiter );
        printf( "Networks are equivalent after structural hashing.\n" );
        return;
    }

    // create the timeframes
    pFrames = Abc_NtkFrames( pMiter, nFrames, 1, 0 );
    Abc_NtkDelete( pMiter );
    if ( pFrames == NULL )
    {
        printf( "Frames computation has failed.\n" );
        return;
    }
    RetValue = Abc_NtkMiterIsConstant( pFrames );
    if ( RetValue == 0 )
    {
        Abc_NtkDelete( pFrames );
        printf( "Networks are NOT EQUIVALENT after framing.\n" );
        return;
    }
    if ( RetValue == 1 )
    {
        Abc_NtkDelete( pFrames );
        printf( "Networks are equivalent after framing.\n" );
        return;
    }

    // convert the miter into a CNF
    pCnf = Abc_NtkMulti( pFrames, 0, 100, 1, 0, 0, 0 );
    Abc_NtkDelete( pFrames );
    if ( pCnf == NULL )
    {
        printf( "Renoding for CNF has failed.\n" );
        return;
    }

    // solve the CNF using the SAT solver
    RetValue = Abc_NtkMiterSat( pCnf, (ABC_INT64_T)nConfLimit, (ABC_INT64_T)nInsLimit, 0, NULL, NULL );
    if ( RetValue == -1 )
        printf( "Networks are undecided (SAT solver timed out).\n" );
    else if ( RetValue == 0 )
        printf( "Networks are NOT EQUIVALENT after SAT.\n" );
    else
        printf( "Networks are equivalent after SAT.\n" );
    Abc_NtkDelete( pCnf );
}